

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmap.c
# Opt level: O3

int cmap_load(char *filename)

{
  int iVar1;
  
  iVar1 = cmap_load_internal(filename);
  if (filename != (char *)0x0 && iVar1 == 0) {
    S_cmap_loaded = 1;
  }
  return iVar1;
}

Assistant:

int cmap_load(char *filename)
{
    int err;
    
    /* try loading the file */
    if ((err = cmap_load_internal(filename)) != 0)
        return err;

    /* 
     *   note that we've explicitly loaded a character set, if they named
     *   a character set (if not, this simply establishes the default
     *   setting, so we haven't explicitly loaded anything) 
     */
    if (filename != 0)
        S_cmap_loaded = TRUE;

    /* success */
    return 0;
}